

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_InvalidMinimumEditionError_Test
::~CommandLineInterfaceTest_InvalidMinimumEditionError_Test
          (CommandLineInterfaceTest_InvalidMinimumEditionError_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, InvalidMinimumEditionError) {
  CreateTempFile("foo.proto", R"schema(edition = "2023";)schema");

  mock_generator_->set_minimum_edition(EDITION_1_TEST_ONLY);

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "generator --test_out specifies a minimum edition 1_TEST_ONLY which is "
      "not the protoc minimum PROTO2");
}